

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

void __thiscall
VectorWriter::VectorWriter<long&>
          (VectorWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchDataIn,
          size_t nPosIn,long *args)

{
  long lVar1;
  size_t in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  VectorWriter *in_RSI;
  long in_FS_OFFSET;
  VectorWriter *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  VectorWriter(in_RSI,in_RDX,in_RCX);
  SerializeMany<VectorWriter,long>(in_stack_ffffffffffffffc8,(long *)0x10f3ae2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VectorWriter(std::vector<unsigned char>& vchDataIn, size_t nPosIn, Args&&... args) : VectorWriter{vchDataIn, nPosIn}
    {
        ::SerializeMany(*this, std::forward<Args>(args)...);
    }